

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O2

bool __thiscall NurseSolution::addTurn(NurseSolution *this,Turn *turn)

{
  bool bVar1;
  Turn *local_18;
  
  local_18 = turn;
  bVar1 = hasTurn(this,turn);
  if (!bVar1) {
    std::vector<Turn_*,_std::allocator<Turn_*>_>::push_back(&this->turns,&local_18);
  }
  return !bVar1;
}

Assistant:

bool NurseSolution::addTurn(Turn* turn){
    if(!hasTurn(turn))
    {
        turns.push_back(turn);
        return true;
    }
    return false;
}